

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer3Transponder.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::IFF_Layer3Transponder::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,IFF_Layer3Transponder *this)

{
  pointer pKVar1;
  ostream *poVar2;
  pointer pKVar3;
  KStringStream ss;
  KString local_210;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar2 = std::operator<<(local_1a0,"IFF Layer 3 Transponder\n");
  LayerHeader::GetAsString_abi_cxx11_(&local_210,(LayerHeader *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_210);
  poVar2 = std::operator<<(poVar2,"Reporting Simulation: ");
  SimulationIdentifier::GetAsString_abi_cxx11_(&local_1d0,&(this->super_IFF_Layer3).m_RptSim);
  poVar2 = std::operator<<(poVar2,(string *)&local_1d0);
  poVar2 = std::operator<<(poVar2,"Basic Data: ");
  Mode5TransponderBasicData::GetAsString_abi_cxx11_(&local_1f0,&this->m_BasicData);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  poVar2 = std::operator<<(poVar2,"Num IFF Records: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->super_IFF_Layer3).m_ui16NumIffRecs);
  std::operator<<(poVar2,"\nIFF Records:\n");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_210);
  pKVar1 = (this->super_IFF_Layer3).m_vStdVarRecs.
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar3 = (this->super_IFF_Layer3).m_vStdVarRecs.
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar3 != pKVar1; pKVar3 = pKVar3 + 1) {
    (*(pKVar3->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_210);
    std::operator<<(local_1a0,(string *)&local_210);
    std::__cxx11::string::~string((string *)&local_210);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

KString IFF_Layer3Transponder::GetAsString() const
{
    KStringStream ss;

    ss << "IFF Layer 3 Transponder\n"
        << LayerHeader::GetAsString()
        << "Reporting Simulation: " << m_RptSim.GetAsString()
        << "Basic Data: "           << m_BasicData.GetAsString() 
        << "Num IFF Records: "      << m_ui16NumIffRecs 
        << "\nIFF Records:\n";

    vector<KDIS::DATA_TYPE::StdVarPtr>::const_iterator citr = m_vStdVarRecs.begin();
    vector<KDIS::DATA_TYPE::StdVarPtr>::const_iterator citrEnd = m_vStdVarRecs.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << ( *citr )->GetAsString();
    }	

    return ss.str();
}